

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O3

int ffhdr2str(fitsfile *fptr,int exclude_comm,char **exclist,int nexc,char **header,int *nkeys,
             int *status)

{
  bool bVar1;
  char **ppcVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  int match;
  int exact;
  char keyname [75];
  char keybuf [162];
  int local_15c;
  char *local_158;
  int local_150;
  int local_14c;
  int *local_148;
  char **local_140;
  fitsfile *local_138;
  int local_12c;
  char local_128;
  undefined7 uStack_127;
  char local_120;
  char local_d8 [168];
  
  *nkeys = 0;
  iVar4 = *status;
  if (iVar4 < 1) {
    iVar3 = ffghsp(fptr,&local_15c,(int *)0x0,status);
    iVar4 = local_15c;
    if (iVar3 < 1) {
      local_150 = exclude_comm;
      local_138 = fptr;
      local_158 = (char *)calloc((long)(local_15c * 0x50 + 0x51),1);
      *header = local_158;
      if (local_158 == (char *)0x0) {
        *status = 0x71;
        ffpmsg("failed to allocate memory to hold all the header keywords");
      }
      else {
        local_148 = nkeys;
        local_140 = header;
        if (0 < iVar4) {
          lVar8 = 1;
          do {
            ffgrec(local_138,(int)lVar8,local_d8,status);
            sVar5 = strlen(local_d8);
            memcpy(local_d8 + sVar5,
                   "                                                                                "
                   ,0x51);
            local_128 = '\0';
            strncat(&local_128,local_d8,8);
            if (local_150 == 0) {
LAB_001745c9:
              if (nexc < 1) {
                lVar7 = 0;
LAB_001745fd:
                if (lVar7 != nexc) goto LAB_00174627;
              }
              else {
                lVar7 = 0;
                do {
                  ffcmps(exclist[lVar7],&local_128,0,&local_14c,&local_12c);
                  if (local_14c != 0) goto LAB_001745fd;
                  lVar7 = lVar7 + 1;
                } while (nexc != lVar7);
              }
              pcVar6 = local_158;
              strcpy(local_158,local_d8);
              local_158 = pcVar6 + 0x50;
              *local_148 = *local_148 + 1;
            }
            else {
              if (local_128 == ' ') {
                lVar7 = 0x2020202020202020;
              }
              else if (local_128 == 'H') {
                lVar7 = 0x2059524f54534948;
              }
              else {
                if (local_128 != 'C') goto LAB_001745c9;
                lVar7 = 0x20544e454d4d4f43;
              }
              if (local_120 != '\0' || CONCAT71(uStack_127,local_128) != lVar7) goto LAB_001745c9;
            }
LAB_00174627:
            bVar1 = lVar8 < local_15c;
            lVar8 = lVar8 + 1;
          } while (bVar1);
        }
        pcVar6 = local_158;
        memcpy(local_158,
               "END                                                                             ",
               0x51);
        ppcVar2 = local_140;
        *local_148 = *local_148 + 1;
        pcVar6[0x50] = '\0';
        pcVar6 = (char *)realloc(*local_140,(long)*local_148 * 0x50 + 1);
        *ppcVar2 = pcVar6;
      }
    }
    iVar4 = *status;
  }
  return iVar4;
}

Assistant:

int ffhdr2str( fitsfile *fptr,  /* I - FITS file pointer                    */
            int exclude_comm,   /* I - if TRUE, exclude commentary keywords */
            char **exclist,     /* I - list of excluded keyword names       */
            int nexc,           /* I - number of names in exclist           */
            char **header,      /* O - returned header string               */
            int *nkeys,         /* O - returned number of 80-char keywords  */
            int  *status)       /* IO - error status                        */
/*
  read header keywords into a long string of chars.  This routine allocates
  memory for the string, so the calling routine must eventually free the
  memory when it is not needed any more.  If exclude_comm is TRUE, then all 
  the COMMENT, HISTORY, and <blank> keywords will be excluded from the output
  string of keywords.  Any other list of keywords to be excluded may be
  specified with the exclist parameter.
*/
{
    int casesn, match, exact, totkeys;
    long ii, jj;
    char keybuf[162], keyname[FLEN_KEYWORD], *headptr;

    *nkeys = 0;

    if (*status > 0)
        return(*status);

    /* get number of keywords in the header (doesn't include END) */
    if (ffghsp(fptr, &totkeys, NULL, status) > 0)
        return(*status);

    /* allocate memory for all the keywords */
    /* (will reallocate it later to minimize the memory size) */
    
    *header = (char *) calloc ( (totkeys + 1) * 80 + 1, 1);
    if (!(*header))
    {
         *status = MEMORY_ALLOCATION;
         ffpmsg("failed to allocate memory to hold all the header keywords");
         return(*status);
    }

    headptr = *header;
    casesn = FALSE;

    /* read every keyword */
    for (ii = 1; ii <= totkeys; ii++) 
    {
        ffgrec(fptr, ii, keybuf, status);
        /* pad record with blanks so that it is at least 80 chars long */
        strcat(keybuf,
    "                                                                                ");

        keyname[0] = '\0';
        strncat(keyname, keybuf, 8); /* copy the keyword name */
        
        if (exclude_comm)
        {
            if (!FSTRCMP("COMMENT ", keyname) ||
                !FSTRCMP("HISTORY ", keyname) ||
                !FSTRCMP("        ", keyname) )
              continue;  /* skip this commentary keyword */
        }

        /* does keyword match any names in the exclusion list? */
        for (jj = 0; jj < nexc; jj++ )
        {
            ffcmps(exclist[jj], keyname, casesn, &match, &exact);
                 if (match)
                     break;
        }

        if (jj == nexc)
        {
            /* not in exclusion list, add this keyword to the string */
            strcpy(headptr, keybuf);
            headptr += 80;
            (*nkeys)++;
        }
    }

    /* add the END keyword */
    strcpy(headptr,
    "END                                                                             ");
    headptr += 80;
    (*nkeys)++;

    *headptr = '\0';   /* terminate the header string */
    /* minimize the allocated memory */
    *header = (char *) realloc(*header, (*nkeys *80) + 1);  

    return(*status);
}